

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsListS
          (X3DImporter *this,int pAttrIdx,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pValue)

{
  size_t *psVar1;
  FIReader *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  char *pcVar5;
  char *pcVar6;
  _Node *p_Var7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 extraout_RAX;
  char *__s;
  char *pcVar8;
  string tstr;
  allocator<char> local_7d;
  uint local_7c;
  X3DImporter *local_78;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  __s = (char *)(ulong)(uint)pAttrIdx;
  iVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
  sVar4 = strlen((char *)CONCAT44(extraout_var,iVar3));
  if (sVar4 != 0) {
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    local_7c = pAttrIdx;
    local_78 = this;
    iVar3 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar2,__s);
    __s = (char *)CONCAT44(extraout_var_00,iVar3);
    pcVar8 = __s + sVar4;
    this = (X3DImporter *)local_70;
    while( true ) {
      local_70._0_8_ = local_70 + 0x10;
      local_70._8_8_ = 0;
      local_60._M_local_buf[0] = _S_red;
      pcVar5 = strchr(__s,0x22);
      if (pcVar5 == (char *)0x0) break;
      pcVar5 = pcVar5 + 1;
      pcVar6 = strchr(pcVar5,0x22);
      if (pcVar6 == (char *)0x0) goto LAB_005f9b67;
      std::__cxx11::string::resize((ulong)this,(char)((long)pcVar6 - (long)pcVar5));
      memcpy((void *)local_70._0_8_,pcVar5,(long)pcVar6 - (long)pcVar5);
      p_Var7 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pValue,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)
      ;
      std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
      psVar1 = &(pValue->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_,
                        CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1)
        ;
      }
      __s = pcVar6 + 1;
      if (pcVar8 <= __s) {
        return;
      }
    }
    pFVar2 = (local_78->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar3 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar2,(ulong)local_7c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(char *)CONCAT44(extraout_var_01,iVar3),&local_7d);
    Throw_IncorrectAttrValue(local_78,&local_50);
LAB_005f9b67:
    pFVar2 = (local_78->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar3 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar2,(ulong)local_7c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(char *)CONCAT44(extraout_var_02,iVar3),&local_7d);
    Throw_IncorrectAttrValue(local_78,&local_50);
  }
  pFVar2 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  iVar3 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                    (pFVar2,(ulong)__s & 0xffffffff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,(char *)CONCAT44(extraout_var_03,iVar3),(allocator<char> *)&local_50
            );
  Throw_IncorrectAttrValue(this,(string *)local_70);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsListS(const int pAttrIdx, std::list<std::string>& pValue)
{
	// make copy of attribute value - strings list.
	const size_t tok_str_len = strlen(mReader->getAttributeValue(pAttrIdx));
    if ( 0 == tok_str_len )
    {
        Throw_IncorrectAttrValue( mReader->getAttributeName( pAttrIdx ) );
    }

	// get pointer to begin of value.
    char *tok_str = const_cast<char*>(mReader->getAttributeValue(pAttrIdx));
    char *tok_str_end = tok_str + tok_str_len;
	// string list has following format: attr_name='"s1" "s2" "sn"'.
	do
	{
		char* tbeg;
		char* tend;
		size_t tlen;
		std::string tstr;

		// find begin of string(element of string list): "sn".
		tbeg = strstr(tok_str, "\"");
		if(tbeg == nullptr) Throw_IncorrectAttrValue(mReader->getAttributeName(pAttrIdx));

		tbeg++;// forward pointer from '\"' symbol to next after it.
		tok_str = tbeg;
		// find end of string(element of string list): "sn".
		tend = strstr(tok_str, "\"");
		if(tend == nullptr) Throw_IncorrectAttrValue(mReader->getAttributeName(pAttrIdx));

		tok_str = tend + 1;
		// create storage for new string
		tlen = tend - tbeg;
		tstr.resize(tlen);// reserve enough space and copy data
		memcpy((void*)tstr.data(), tbeg, tlen);// not strcpy because end of copied string from tok_str has no terminator.
		// and store string in output list.
		pValue.push_back(tstr);
	} while(tok_str < tok_str_end);
}